

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

int __kmp_execute_tasks_template<kmp_flag_oncore>
              (kmp_info_t *thread,kmp_int32 gtid,kmp_flag_oncore *flag,int final_spin,
              int *thread_finished,void *itt_sync_obj,kmp_int32 is_constrained)

{
  bool bVar1;
  bool bVar2;
  unsigned_short uVar3;
  atomic<int> *paVar4;
  atomic<int> *paVar5;
  int in_ECX;
  long in_RDX;
  kmp_int32 in_ESI;
  kmp_info_t *in_RDI;
  int *in_R8;
  kmp_info_t *in_R9;
  kmp_int32 count;
  int asleep;
  kmp_int32 tid;
  kmp_int32 new_victim;
  kmp_int32 use_own_tasks;
  kmp_int32 victim_tid;
  kmp_int32 nthreads;
  atomic<int> *unfinished_threads;
  kmp_taskdata_t *current_task;
  kmp_info_t *other_thread;
  kmp_task_t *task;
  kmp_thread_data_t *threads_data;
  kmp_task_team_t *task_team;
  memory_order __b;
  void *in_stack_ffffffffffffff28;
  kmp_flag_oncore *in_stack_ffffffffffffff30;
  int local_b4;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  kmp_int32 kVar10;
  kmp_taskdata_t *current_task_00;
  kmp_info_t *in_stack_ffffffffffffff80;
  kmp_task_t *task_00;
  kmp_task_team_t *task_team_00;
  kmp_task_team_t *pkVar11;
  
  pkVar11 = (in_RDI->th).th_task_team;
  current_task_00 = (in_RDI->th).th_current_task;
  iVar9 = -2;
  bVar1 = false;
  iVar7 = *(int *)(in_RDI->th_pad + 0x20);
  if ((pkVar11 != (kmp_task_team_t *)0x0) && (current_task_00 != (kmp_taskdata_t *)0x0)) {
    (in_RDI->th).th_reap_state = 0;
    task_team_00 = (kmp_task_team_t *)(pkVar11->tt).tt_threads_data;
    kVar10 = (pkVar11->tt).tt_nproc;
    paVar4 = &(pkVar11->tt).tt_unfinished_threads;
    do {
      iVar8 = 1;
      while( true ) {
        task_00 = (kmp_task_t *)0x0;
        if (iVar8 != 0) {
          task_00 = __kmp_remove_my_task
                              ((kmp_info_t *)CONCAT44(kVar10,iVar9),iVar8,
                               (kmp_task_team_t *)CONCAT44(iVar7,in_stack_ffffffffffffff58),
                               in_stack_ffffffffffffff54);
        }
        if ((task_00 == (kmp_task_t *)0x0) && (1 < kVar10)) {
          in_stack_ffffffffffffff58 = 1;
          iVar8 = 0;
          if ((iVar9 == -2) &&
             (iVar9 = *(int *)((long)task_team_00 + (long)iVar7 * 0xc0 + 0x98), iVar9 != -1)) {
            in_stack_ffffffffffffff80 = *(kmp_info_t **)((long)task_team_00 + (long)iVar9 * 0xc0);
          }
          if (iVar9 == -1) {
            if (!bVar1) {
              do {
                uVar3 = __kmp_get_random(in_RDI);
                iVar9 = (int)((long)(ulong)uVar3 % (long)(kVar10 + -1));
                if (iVar7 <= iVar9) {
                  iVar9 = iVar9 + 1;
                }
                in_stack_ffffffffffffff80 =
                     (((kmp_thread_data_t *)((long)task_team_00 + (long)iVar9 * 0xc0))->td).td_thr;
                iVar6 = 0;
                if (((__kmp_tasking_mode == tskm_max) && (__kmp_dflt_blocktime != 0x7fffffff)) &&
                   ((in_stack_ffffffffffffff80->th).th_sleep_loc != (void *)0x0)) {
                  iVar6 = 1;
                  __kmp_gtid_from_thread(in_stack_ffffffffffffff80);
                  __kmp_null_resume_wrapper
                            ((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                             in_stack_ffffffffffffff28);
                }
              } while (iVar6 != 0);
              in_stack_ffffffffffffff58 = 0;
            }
          }
          else {
            in_stack_ffffffffffffff58 = 0;
          }
          if (in_stack_ffffffffffffff58 == 0) {
            task_00 = __kmp_steal_task(in_R9,(kmp_int32)((ulong)pkVar11 >> 0x20),task_team_00,
                                       (atomic<int> *)task_00,
                                       (int *)in_stack_ffffffffffffff80->th_pad,
                                       (kmp_int32)((ulong)current_task_00 >> 0x20));
          }
          if (task_00 == (kmp_task_t *)0x0) {
            if (*(int *)((long)task_team_00 + (long)iVar7 * 0xc0 + 0x98) != -1) {
              *(undefined4 *)((long)task_team_00 + (long)iVar7 * 0xc0 + 0x98) = 0xffffffff;
            }
            iVar9 = -2;
          }
          else if (*(int *)((long)task_team_00 + (long)iVar7 * 0xc0 + 0x98) != iVar9) {
            *(int *)((long)task_team_00 + (long)iVar7 * 0xc0 + 0x98) = iVar9;
            bVar1 = true;
          }
        }
        if (task_00 == (kmp_task_t *)0x0) break;
        if (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0) {
          if (in_R9 == (kmp_info_t *)0x0) {
            in_R9 = (kmp_info_t *)
                    __kmp_itt_barrier_object
                              ((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                               (int)in_stack_ffffffffffffff80,(int)((ulong)current_task_00 >> 0x20),
                               (int)current_task_00);
          }
          __kmp_itt_task_starting((void *)0x164bc6);
        }
        __kmp_invoke_task(in_ESI,task_00,current_task_00);
        if (in_R9 != (kmp_info_t *)0x0) {
          __kmp_itt_task_finished((void *)0x164bee);
        }
        if ((in_RDX == 0) ||
           ((in_ECX == 0 && (bVar2 = kmp_flag_oncore::done_check(in_stack_ffffffffffffff30), bVar2))
           )) {
          return 1;
        }
        if ((in_RDI->th).th_task_team == (kmp_task_team_t *)0x0) break;
        __kmp_x86_pause();
        if (__kmp_library == library_throughput) {
          if (__kmp_use_yield == 1) {
LAB_00164ca7:
            __kmp_yield();
          }
          else if (__kmp_use_yield == 2) {
            if (__kmp_avail_proc == 0) {
              local_b4 = __kmp_xproc;
            }
            else {
              local_b4 = __kmp_avail_proc;
            }
            if (local_b4 < __kmp_nth) goto LAB_00164ca7;
          }
        }
        if ((iVar8 == 0) && (*(int *)((long)task_team_00 + (long)iVar7 * 0xc0 + 0x94) != 0)) {
          iVar8 = 1;
          bVar1 = false;
        }
      }
      if ((in_ECX != 0) &&
         (paVar5 = &current_task_00->td_incomplete_child_tasks,
         std::operator&(memory_order_acquire,__memory_order_mask),
         (paVar5->super___atomic_base<int>)._M_i == 0)) {
        if (*in_R8 == 0) {
          LOCK();
          iVar8 = (paVar4->super___atomic_base<int>)._M_i;
          (paVar4->super___atomic_base<int>)._M_i = (paVar4->super___atomic_base<int>)._M_i + -1;
          UNLOCK();
          in_stack_ffffffffffffff54 = iVar8 + -1;
          *in_R8 = 1;
          in_stack_ffffffffffffff30 = (kmp_flag_oncore *)paVar4;
        }
        if ((in_RDX != 0) && (bVar2 = kmp_flag_oncore::done_check(in_stack_ffffffffffffff30), bVar2)
           ) {
          return 1;
        }
      }
      if ((in_RDI->th).th_task_team == (kmp_task_team_t *)0x0) {
        return 0;
      }
    } while (kVar10 == 1);
  }
  return 0;
}

Assistant:

static inline int __kmp_execute_tasks_template(
    kmp_info_t *thread, kmp_int32 gtid, C *flag, int final_spin,
    int *thread_finished USE_ITT_BUILD_ARG(void *itt_sync_obj),
    kmp_int32 is_constrained) {
  kmp_task_team_t *task_team = thread->th.th_task_team;
  kmp_thread_data_t *threads_data;
  kmp_task_t *task;
  kmp_info_t *other_thread;
  kmp_taskdata_t *current_task = thread->th.th_current_task;
  std::atomic<kmp_int32> *unfinished_threads;
  kmp_int32 nthreads, victim_tid = -2, use_own_tasks = 1, new_victim = 0,
                      tid = thread->th.th_info.ds.ds_tid;

  KMP_DEBUG_ASSERT(__kmp_tasking_mode != tskm_immediate_exec);
  KMP_DEBUG_ASSERT(thread == __kmp_threads[gtid]);

  if (task_team == NULL || current_task == NULL)
    return FALSE;

  KA_TRACE(15, ("__kmp_execute_tasks_template(enter): T#%d final_spin=%d "
                "*thread_finished=%d\n",
                gtid, final_spin, *thread_finished));

  thread->th.th_reap_state = KMP_NOT_SAFE_TO_REAP;
  threads_data = (kmp_thread_data_t *)TCR_PTR(task_team->tt.tt_threads_data);
  KMP_DEBUG_ASSERT(threads_data != NULL);

  nthreads = task_team->tt.tt_nproc;
  unfinished_threads = &(task_team->tt.tt_unfinished_threads);
  KMP_DEBUG_ASSERT(nthreads > 1 || task_team->tt.tt_found_proxy_tasks);
  KMP_DEBUG_ASSERT(*unfinished_threads >= 0);

  while (1) { // Outer loop keeps trying to find tasks in case of single thread
    // getting tasks from target constructs
    while (1) { // Inner loop to find a task and execute it
      task = NULL;
      if (use_own_tasks) { // check on own queue first
        task = __kmp_remove_my_task(thread, gtid, task_team, is_constrained);
      }
      if ((task == NULL) && (nthreads > 1)) { // Steal a task
        int asleep = 1;
        use_own_tasks = 0;
        // Try to steal from the last place I stole from successfully.
        if (victim_tid == -2) { // haven't stolen anything yet
          victim_tid = threads_data[tid].td.td_deque_last_stolen;
          if (victim_tid !=
              -1) // if we have a last stolen from victim, get the thread
            other_thread = threads_data[victim_tid].td.td_thr;
        }
        if (victim_tid != -1) { // found last victim
          asleep = 0;
        } else if (!new_victim) { // no recent steals and we haven't already
          // used a new victim; select a random thread
          do { // Find a different thread to steal work from.
            // Pick a random thread. Initial plan was to cycle through all the
            // threads, and only return if we tried to steal from every thread,
            // and failed.  Arch says that's not such a great idea.
            victim_tid = __kmp_get_random(thread) % (nthreads - 1);
            if (victim_tid >= tid) {
              ++victim_tid; // Adjusts random distribution to exclude self
            }
            // Found a potential victim
            other_thread = threads_data[victim_tid].td.td_thr;
            // There is a slight chance that __kmp_enable_tasking() did not wake
            // up all threads waiting at the barrier.  If victim is sleeping,
            // then wake it up. Since we were going to pay the cache miss
            // penalty for referencing another thread's kmp_info_t struct
            // anyway,
            // the check shouldn't cost too much performance at this point. In
            // extra barrier mode, tasks do not sleep at the separate tasking
            // barrier, so this isn't a problem.
            asleep = 0;
            if ((__kmp_tasking_mode == tskm_task_teams) &&
                (__kmp_dflt_blocktime != KMP_MAX_BLOCKTIME) &&
                (TCR_PTR(CCAST(void *, other_thread->th.th_sleep_loc)) !=
                 NULL)) {
              asleep = 1;
              __kmp_null_resume_wrapper(__kmp_gtid_from_thread(other_thread),
                                        other_thread->th.th_sleep_loc);
              // A sleeping thread should not have any tasks on it's queue.
              // There is a slight possibility that it resumes, steals a task
              // from another thread, which spawns more tasks, all in the time
              // that it takes this thread to check => don't write an assertion
              // that the victim's queue is empty.  Try stealing from a
              // different thread.
            }
          } while (asleep);
        }

        if (!asleep) {
          // We have a victim to try to steal from
          task = __kmp_steal_task(other_thread, gtid, task_team,
                                  unfinished_threads, thread_finished,
                                  is_constrained);
        }
        if (task != NULL) { // set last stolen to victim
          if (threads_data[tid].td.td_deque_last_stolen != victim_tid) {
            threads_data[tid].td.td_deque_last_stolen = victim_tid;
            // The pre-refactored code did not try more than 1 successful new
            // vicitm, unless the last one generated more local tasks;
            // new_victim keeps track of this
            new_victim = 1;
          }
        } else { // No tasks found; unset last_stolen
          KMP_CHECK_UPDATE(threads_data[tid].td.td_deque_last_stolen, -1);
          victim_tid = -2; // no successful victim found
        }
      }

      if (task == NULL) // break out of tasking loop
        break;

// Found a task; execute it
#if USE_ITT_BUILD && USE_ITT_NOTIFY
      if (__itt_sync_create_ptr || KMP_ITT_DEBUG) {
        if (itt_sync_obj == NULL) { // we are at fork barrier where we could not
          // get the object reliably
          itt_sync_obj = __kmp_itt_barrier_object(gtid, bs_forkjoin_barrier);
        }
        __kmp_itt_task_starting(itt_sync_obj);
      }
#endif /* USE_ITT_BUILD && USE_ITT_NOTIFY */
      __kmp_invoke_task(gtid, task, current_task);
#if USE_ITT_BUILD
      if (itt_sync_obj != NULL)
        __kmp_itt_task_finished(itt_sync_obj);
#endif /* USE_ITT_BUILD */
      // If this thread is only partway through the barrier and the condition is
      // met, then return now, so that the barrier gather/release pattern can
      // proceed. If this thread is in the last spin loop in the barrier,
      // waiting to be released, we know that the termination condition will not
      // be satisified, so don't waste any cycles checking it.
      if (flag == NULL || (!final_spin && flag->done_check())) {
        KA_TRACE(
            15,
            ("__kmp_execute_tasks_template: T#%d spin condition satisfied\n",
             gtid));
        return TRUE;
      }
      if (thread->th.th_task_team == NULL) {
        break;
      }
      KMP_YIELD(__kmp_library == library_throughput); // Yield before next task
      // If execution of a stolen task results in more tasks being placed on our
      // run queue, reset use_own_tasks
      if (!use_own_tasks && TCR_4(threads_data[tid].td.td_deque_ntasks) != 0) {
        KA_TRACE(20, ("__kmp_execute_tasks_template: T#%d stolen task spawned "
                      "other tasks, restart\n",
                      gtid));
        use_own_tasks = 1;
        new_victim = 0;
      }
    }

    // The task source has been exhausted. If in final spin loop of barrier,
    // check if termination condition is satisfied. The work queue may be empty
    // but there might be proxy tasks still executing.
    if (final_spin &&
        KMP_ATOMIC_LD_ACQ(&current_task->td_incomplete_child_tasks) == 0) {
      // First, decrement the #unfinished threads, if that has not already been
      // done.  This decrement might be to the spin location, and result in the
      // termination condition being satisfied.
      if (!*thread_finished) {
        kmp_int32 count;

        count = KMP_ATOMIC_DEC(unfinished_threads) - 1;
        KA_TRACE(20, ("__kmp_execute_tasks_template: T#%d dec "
                      "unfinished_threads to %d task_team=%p\n",
                      gtid, count, task_team));
        *thread_finished = TRUE;
      }

      // It is now unsafe to reference thread->th.th_team !!!
      // Decrementing task_team->tt.tt_unfinished_threads can allow the master
      // thread to pass through the barrier, where it might reset each thread's
      // th.th_team field for the next parallel region. If we can steal more
      // work, we know that this has not happened yet.
      if (flag != NULL && flag->done_check()) {
        KA_TRACE(
            15,
            ("__kmp_execute_tasks_template: T#%d spin condition satisfied\n",
             gtid));
        return TRUE;
      }
    }

    // If this thread's task team is NULL, master has recognized that there are
    // no more tasks; bail out
    if (thread->th.th_task_team == NULL) {
      KA_TRACE(15,
               ("__kmp_execute_tasks_template: T#%d no more tasks\n", gtid));
      return FALSE;
    }

    // We could be getting tasks from target constructs; if this is the only
    // thread, keep trying to execute tasks from own queue
    if (nthreads == 1)
      use_own_tasks = 1;
    else {
      KA_TRACE(15,
               ("__kmp_execute_tasks_template: T#%d can't find work\n", gtid));
      return FALSE;
    }
  }
}